

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.cpp
# Opt level: O0

float * stbi__loadf_main(stbi__context *s,int *x,int *y,int *comp,int req_comp)

{
  int iVar1;
  float *y_00;
  uchar *puVar2;
  undefined8 in_RCX;
  int req_comp_00;
  int *in_RDX;
  int *in_RSI;
  int *in_RDI;
  float *hdr_data;
  stbi__result_info ri;
  uchar *data;
  stbi__result_info *in_stack_000003f0;
  int in_stack_000003fc;
  int *in_stack_00000400;
  int *in_stack_00000408;
  int *in_stack_00000410;
  stbi__context *in_stack_00000418;
  stbi__context *in_stack_ffffffffffffffa0;
  int req_comp_01;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  undefined8 in_stack_ffffffffffffffb0;
  int *in_stack_ffffffffffffffb8;
  float *in_stack_ffffffffffffffc0;
  stbi__context *in_stack_fffffffffffffff8;
  
  req_comp_00 = (int)((ulong)in_RCX >> 0x20);
  iVar1 = stbi__hdr_test(in_stack_ffffffffffffffa0);
  req_comp_01 = (int)((ulong)in_stack_ffffffffffffffa0 >> 0x20);
  if (iVar1 == 0) {
    puVar2 = stbi__load_and_postprocess_8bit
                       (in_stack_fffffffffffffff8,in_RDI,in_RSI,in_RDX,req_comp_00);
    if (puVar2 == (uchar *)0x0) {
      stbi__err("unknown image type");
      y_00 = (float *)0x0;
    }
    else {
      y_00 = stbi__ldr_to_hdr((stbi_uc *)in_stack_ffffffffffffffb8,
                              (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
                              (int)in_stack_ffffffffffffffb0,*in_RDX);
    }
  }
  else {
    y_00 = stbi__hdr_load(in_stack_00000418,in_stack_00000410,in_stack_00000408,in_stack_00000400,
                          in_stack_000003fc,in_stack_000003f0);
    if (y_00 != (float *)0x0) {
      stbi__float_postprocess
                (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,(int *)y_00,
                 (int *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),req_comp_01);
    }
  }
  return y_00;
}

Assistant:

static float *stbi__loadf_main(stbi__context *s, int *x, int *y, int *comp, int req_comp)
{
   unsigned char *data;
   #ifndef STBI_NO_HDR
   if (stbi__hdr_test(s)) {
      stbi__result_info ri;
      float *hdr_data = stbi__hdr_load(s,x,y,comp,req_comp, &ri);
      if (hdr_data)
         stbi__float_postprocess(hdr_data,x,y,comp,req_comp);
      return hdr_data;
   }
   #endif
   data = stbi__load_and_postprocess_8bit(s, x, y, comp, req_comp);
   if (data)
      return stbi__ldr_to_hdr(data, *x, *y, req_comp ? req_comp : *comp);
   return stbi__errpf("unknown image type", "Image not of any known type, or corrupt");
}